

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::analyzeFinal(Solver *this,Lit p,LSet *out_conflict)

{
  uint uVar1;
  VarData *pVVar2;
  uint *puVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
            (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,false);
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::insert
            (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,p);
  if ((this->trail_lim).sz == 0) {
    return;
  }
  iVar5 = p.x >> 1;
  if (iVar5 < (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz) {
    (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar5] = '\x01';
    iVar10 = (this->trail).sz;
    lVar9 = (long)iVar10;
    iVar8 = *(this->trail_lim).data;
    if (iVar8 < iVar10) {
      do {
        uVar7 = (this->trail).data[lVar9 + -1].x;
        iVar10 = (int)uVar7 >> 1;
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar10)
        goto LAB_0010b2d5;
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar10] !=
            '\0') {
          if ((this->vardata).
              super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
              iVar10) {
LAB_0010b2b6:
            __assert_fail("has(k)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                          ,0x27,
                          "const V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) const [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
                         );
          }
          pVVar2 = (this->vardata).
                   super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
                   data;
          uVar1 = pVVar2[iVar10].reason;
          uVar4 = (ulong)uVar1;
          if (uVar4 == 0xffffffff) {
            if (pVVar2[iVar10].level < 1) {
              __assert_fail("level(x) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                            ,0x1d6,"void Minisat::Solver::analyzeFinal(Lit, LSet &)");
            }
            IntSet<Minisat::Lit,_Minisat::MkIndexLit>::insert
                      (&out_conflict->super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,
                       (Lit)(uVar7 ^ 1));
          }
          else {
            if ((this->ca).ra.sz <= uVar1) {
              __assert_fail("r < sz",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                            ,0x3f,
                            "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            puVar3 = (this->ca).ra.memory;
            uVar7 = puVar3[uVar4];
            if (0x3f < uVar7) {
              uVar6 = 1;
              do {
                iVar8 = (int)puVar3[uVar4 + uVar6 + 1] >> 1;
                if ((this->vardata).
                    super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
                    sz <= iVar8) goto LAB_0010b2b6;
                if (0 < (this->vardata).
                        super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.
                        map.data[iVar8].level) {
                  if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
                      iVar8) goto LAB_0010b2d5;
                  (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
                  [iVar8] = '\x01';
                  uVar7 = puVar3[uVar4];
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < uVar7 >> 5);
            }
          }
          if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar10)
          goto LAB_0010b2d5;
          (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar10] =
               '\0';
          iVar8 = *(this->trail_lim).data;
        }
        lVar9 = lVar9 + -1;
      } while (iVar8 < lVar9);
    }
    if (iVar5 < (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz) {
      (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar5] = '\0';
      return;
    }
  }
LAB_0010b2d5:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void Solver::analyzeFinal(Lit p, LSet& out_conflict)
{
    out_conflict.clear();
    out_conflict.insert(p);

    if (decisionLevel() == 0)
        return;

    seen[var(p)] = 1;

    for (int i = trail.size()-1; i >= trail_lim[0]; i--){
        Var x = var(trail[i]);
        if (seen[x]){
            if (reason(x) == CRef_Undef){
                assert(level(x) > 0);
                out_conflict.insert(~trail[i]);
            }else{
                Clause& c = ca[reason(x)];
                for (int j = 1; j < c.size(); j++)
                    if (level(var(c[j])) > 0)
                        seen[var(c[j])] = 1;
            }
            seen[x] = 0;
        }
    }

    seen[var(p)] = 0;
}